

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_kj::StringPtr,_const_kj::StringPtr>::
ArrayComparisonTest(ArrayComparisonTest<const_kj::StringPtr,_const_kj::StringPtr> *this,
                   initializer_list<const_kj::StringPtr> left,
                   initializer_list<const_kj::StringPtr> right,TestOrdering expectedResult)

{
  StringPtr *end;
  StringPtr *pSVar1;
  initializer_list<const_kj::StringPtr> init;
  
  end = right._M_array;
  pSVar1 = end;
  heapArray<kj::StringPtr_const,kj::StringPtr_const*>
            (&this->left,(kj *)left._M_array,(StringPtr *)((kj *)left._M_array + 0x20),end);
  init._M_len = (size_type)pSVar1;
  init._M_array = end;
  heapArray<kj::StringPtr_const>(&this->right,(kj *)left._M_len,init);
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}